

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitops.hpp
# Opt level: O1

uint reference_ceillog2(uint x)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = 0x1f;
  if (x != 0) {
    for (; x >> uVar1 == 0; uVar1 = uVar1 - 1) {
    }
  }
  iVar2 = (uVar1 ^ 0xffffffe0) + 0x21;
  if (x == 0) {
    iVar2 = 0;
  }
  return iVar2 - (uint)((x - 1 & x) == 0);
}

Assistant:

unsigned int reference_ceillog2(unsigned int x) {
    unsigned int log_floor = 0;
    unsigned int n = x;
    for (;n != 0; n >>= 1)
    {
        ++log_floor;
    }
    --log_floor;
    // add one if not power of 2
    return log_floor + (((x&(x-1)) != 0) ? 1 : 0);
}